

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O0

void al_set_separate_blender(int op,int src,int dst,int alpha_op,int alpha_src,int alpha_dst)

{
  thread_local_state *ptVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  int in_R8D;
  int in_R9D;
  ALLEGRO_BLENDER *b;
  thread_local_state *tls;
  
  ptVar1 = tls_get();
  if (ptVar1 != (thread_local_state *)0x0) {
    (ptVar1->current_blender).blend_op = in_EDI;
    (ptVar1->current_blender).blend_source = in_ESI;
    (ptVar1->current_blender).blend_dest = in_EDX;
    (ptVar1->current_blender).blend_alpha_op = in_ECX;
    (ptVar1->current_blender).blend_alpha_source = in_R8D;
    (ptVar1->current_blender).blend_alpha_dest = in_R9D;
  }
  return;
}

Assistant:

void al_set_separate_blender(int op, int src, int dst,
   int alpha_op, int alpha_src, int alpha_dst)
{
   thread_local_state *tls;
   ALLEGRO_BLENDER *b;

   ASSERT(op >= 0 && op < ALLEGRO_NUM_BLEND_OPERATIONS);
   ASSERT(src >= 0 && src < ALLEGRO_NUM_BLEND_MODES);
   ASSERT(dst >= 0 && src < ALLEGRO_NUM_BLEND_MODES);
   ASSERT(alpha_op >= 0 && alpha_op < ALLEGRO_NUM_BLEND_OPERATIONS);
   ASSERT(alpha_src >= 0 && alpha_src < ALLEGRO_NUM_BLEND_MODES);
   ASSERT(alpha_dst >= 0 && alpha_dst < ALLEGRO_NUM_BLEND_MODES);

   if ((tls = tls_get()) == NULL)
      return;

   b = &tls->current_blender;

   b->blend_op = op;
   b->blend_source = src;
   b->blend_dest = dst;
   b->blend_alpha_op = alpha_op;
   b->blend_alpha_source = alpha_src;
   b->blend_alpha_dest = alpha_dst;
}